

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int balance(BtCursor *pCur)

{
  byte bVar1;
  u8 uVar2;
  ushort uVar3;
  u32 uVar4;
  BtShared *pBVar5;
  uint *puVar6;
  sqlite3_backup *psVar7;
  PgHdr *p;
  Bitvec *pCellptr;
  MemPage *pPage;
  undefined8 uVar8;
  MemPage *pMVar9;
  char cVar10;
  u16 uVar11;
  ushort uVar12;
  ushort uVar13;
  uint uVar14;
  int iVar15;
  BtCursor *pBVar16;
  u8 *puVar17;
  ulong uVar18;
  long lVar19;
  u8 *puVar20;
  undefined8 *puVar21;
  ulong *puVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  ulong *puVar26;
  Pager *pPVar27;
  int iVar28;
  int iVar29;
  Pager *pPVar30;
  long lVar31;
  MemPage *pMVar32;
  ulong uVar33;
  ulong *puVar34;
  Pager *pPVar35;
  MemPage *pMVar36;
  MemPage *pMVar37;
  Pager *pPVar38;
  Pager *pPVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  Pgno PVar44;
  uint uVar45;
  int iVar46;
  u8 *puVar47;
  size_t __n;
  bool bVar48;
  Pgno pgnoNew;
  u8 *pCell;
  int szNew [5];
  u8 abDone [5];
  int rc;
  MemPage *pNew;
  MemPage *pChild;
  u16 szCell;
  u8 *apDiv [2];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  uint local_284;
  Pager *local_280;
  Pager *local_278;
  Pager *local_270;
  ulong local_268;
  ulong local_260;
  ulong local_258;
  Pager *local_250;
  Pager *local_248;
  Pager *local_240;
  MemPage *local_238;
  uint local_22c;
  MemPage *local_228;
  ulong local_220;
  BtShared *local_218;
  MemPage *local_210;
  uint local_204;
  undefined8 local_200;
  Pgno local_1f8;
  uint local_1f4 [7];
  undefined1 local_1d8 [64];
  BtCursor *local_198;
  Pager *local_190;
  char local_188 [8];
  u8 *local_180;
  u8 *local_178;
  uint local_16c;
  CellInfo local_168;
  u8 *local_150;
  undefined8 local_148;
  ulong local_140 [5];
  CellArray local_118;
  Pager **local_a8;
  uint *local_a0;
  u16 local_98 [12];
  Pager *local_80 [4];
  long local_60;
  u8 local_55 [4];
  u8 auStack_51 [9];
  uint auStack_48 [6];
  
  puVar17 = (u8 *)0x0;
  local_198 = pCur;
LAB_00166213:
  pMVar32 = pCur->pPage;
  if (-1 < pMVar32->nFree) {
LAB_00166220:
    if (pMVar32->nOverflow == '\0') {
      iVar15 = pMVar32->nFree * 3;
      uVar4 = pCur->pBt->usableSize;
      iVar28 = uVar4 * 2;
      bVar48 = false;
      if (iVar15 == iVar28 || SBORROW4(iVar15,iVar28) != (int)(iVar15 + uVar4 * -2) < 0)
      goto LAB_00166628;
    }
    lVar19 = (long)pCur->iPage;
    if (lVar19 == 0) {
      if (pMVar32->nOverflow == '\0') {
        bVar48 = false;
        goto LAB_00166628;
      }
      uVar14 = 0;
      bVar48 = true;
      for (pBVar16 = pCur->pBt->pCursor; pBVar16 != (BtCursor *)0x0; pBVar16 = pBVar16->pNext) {
        if (((pBVar16 != pCur) && (pBVar16->eState == '\0')) && (pBVar16->pPage == pCur->pPage)) {
          bVar48 = false;
          uVar14 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
          break;
        }
      }
      if (bVar48) {
        local_118._0_8_ = (MemPage *)0x0;
        local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffff00000000;
        pBVar5 = pMVar32->pBt;
        local_148._0_4_ = sqlite3PagerWrite(pMVar32->pDbPage);
        if ((uint)local_148 == 0) {
          local_148._0_4_ =
               allocateBtreePage(pBVar5,(MemPage **)&local_118,(Pgno *)local_1d8,pMVar32->pgno,'\0')
          ;
          copyNodeContent(pMVar32,(MemPage *)local_118._0_8_,(int *)&local_148);
          if (pBVar5->autoVacuum != '\0') {
            ptrmapPut(pBVar5,local_1d8._0_4_,'\x05',pMVar32->pgno,(int *)&local_148);
          }
        }
        uVar8 = local_118._0_8_;
        uVar14 = (uint)local_148;
        if ((uint)local_148 == 0) {
          memcpy((u16 *)(local_118._0_8_ + 0x1c),pMVar32->aiOvfl,
                 (ulong)((uint)pMVar32->nOverflow * 2));
          memcpy((u8 **)(uVar8 + 0x28),pMVar32->apOvfl,(ulong)pMVar32->nOverflow << 3);
          *(u8 *)(uVar8 + 0xc) = pMVar32->nOverflow;
          zeroPage(pMVar32,**(u8 **)(uVar8 + 0x50) & 0xfffffff7);
          *(uint *)(pMVar32->aData + (ulong)pMVar32->hdrOffset + 8) =
               (uint)local_1d8._0_4_ >> 0x18 | (local_1d8._0_4_ & 0xff0000) >> 8 |
               (local_1d8._0_4_ & 0xff00) << 8 | local_1d8._0_4_ << 0x18;
          pCur->apPage[1] = (MemPage *)uVar8;
          uVar14 = 0;
        }
        else {
          pCur->apPage[1] = (MemPage *)0x0;
          if ((MemPage *)local_118._0_8_ != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(*(DbPage **)(local_118._0_8_ + 0x70));
          }
        }
        bVar48 = true;
        if (uVar14 == 0) {
          pCur->iPage = '\x01';
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pMVar32;
          pCur->pPage = pCur->apPage[1];
          goto LAB_00166628;
        }
      }
      else {
        bVar48 = false;
      }
      goto LAB_001670cb;
    }
    puVar47 = puVar17;
    if (pMVar32->pDbPage->nRef < 2) {
      pMVar37 = pCur->apPage[lVar19 + -1];
      local_210 = (MemPage *)(ulong)pCur->aiIdx[lVar19 + -1];
      local_60 = lVar19;
      uVar14 = sqlite3PagerWrite(pMVar37->pDbPage);
      if ((uVar14 == 0) && (uVar14 = 0, pMVar37->nFree < 0)) {
        uVar14 = btreeComputeFreeSpace(pMVar37);
      }
      local_238 = pMVar37;
      if (uVar14 == 0) {
        if (((pMVar32->intKeyLeaf != '\0') && (pMVar32->nOverflow == '\x01')) &&
           ((pMVar32->aiOvfl[0] == pMVar32->nCell &&
            ((pMVar37->pgno != 1 && (pMVar37->nCell == (u16)local_210)))))) {
          if (pMVar32->nCell == 0) {
            uVar14 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x127bb);
            pCur = local_198;
          }
          else {
            pBVar5 = pMVar32->pBt;
            iVar15 = allocateBtreePage(pBVar5,(MemPage **)&local_148,&local_1f8,0,'\0');
            local_168.nKey = CONCAT44(local_168.nKey._4_4_,iVar15);
            if (iVar15 == 0) {
              local_1d8._0_8_ = pMVar32->apOvfl[0];
              local_98[0] = (*pMVar32->xCellSize)(pMVar32,(u8 *)local_1d8._0_8_);
              pMVar37 = (MemPage *)CONCAT44(local_148._4_4_,(uint)local_148);
              zeroPage(pMVar37,0xd);
              local_118.nCell = 1;
              local_118.apCell = (u8 **)local_1d8;
              local_118.szCell = local_98;
              local_118.apEnd[0] = pMVar32->aDataEnd;
              local_118.ixNx[0] = 2;
              local_118.pRef = pMVar32;
              uVar14 = rebuildPage(&local_118,0,1,pMVar37);
              pPage = local_238;
              local_168.nKey = CONCAT44(local_168.nKey._4_4_,uVar14);
              if (uVar14 == 0) {
                pMVar37->nFree =
                     (pBVar5->usableSize - ((uint)local_98[0] + (uint)pMVar37->cellOffset)) + -2;
                if ((pBVar5->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar5,local_1f8,'\x05',local_238->pgno,(int *)&local_168),
                   pMVar37->minLocal < local_98[0])) {
                  ptrmapPutOvflPtr(pMVar37,pMVar37,(u8 *)local_1d8._0_8_,(int *)&local_168);
                }
                uVar42 = (ulong)(CONCAT11(pMVar32->aCellIdx[(ulong)pMVar32->nCell * 2 + -2],
                                          pMVar32->aCellIdx[(ulong)pMVar32->nCell * 2 + -1]) &
                                pMVar32->maskPage);
                uVar33 = 0;
                puVar17 = pMVar32->aData + uVar42;
                pMVar9 = (MemPage *)(pMVar32->aData + uVar42 + 2);
                do {
                  pMVar36 = pMVar9;
                  puVar20 = puVar17;
                  if (7 < uVar33) break;
                  uVar33 = uVar33 + 1;
                  puVar17 = puVar20 + 1;
                  pMVar9 = (MemPage *)&pMVar36->intKey;
                } while ((char)*puVar20 < '\0');
                lVar19 = 4;
                do {
                  local_1d8._0_8_ = pMVar36;
                  uVar2 = *(u8 *)((long)&((MemPage *)(local_1d8._0_8_ + -0x88))->xParseCell + 7);
                  local_55[lVar19] = uVar2;
                  lVar19 = lVar19 + 1;
                  if (-1 < (char)uVar2) break;
                  pMVar36 = (MemPage *)&((MemPage *)local_1d8._0_8_)->intKey;
                } while ((ulong)local_1d8._0_8_ < (MemPage *)(puVar20 + 10));
                if ((uint)local_168.nKey == 0) {
                  insertCell(pPage,(uint)pPage->nCell,local_55,(int)lVar19,(u8 *)0x0,pMVar32->pgno,
                             (int *)&local_168);
                }
                *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
                     local_1f8 >> 0x18 | (local_1f8 & 0xff0000) >> 8 | (local_1f8 & 0xff00) << 8 |
                     local_1f8 << 0x18;
              }
              if (pMVar37 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar37->pDbPage);
              }
              pCur = local_198;
              if (uVar14 != 0) goto LAB_0016709a;
            }
            pCur = local_198;
            uVar14 = (uint)local_168.nKey;
          }
          goto LAB_0016709a;
        }
        local_150 = (u8 *)pcache1Alloc(pCur->pBt->pageSize);
        local_284 = 0;
        local_188[0] = '\0';
        local_188[1] = '\0';
        local_188[2] = '\0';
        local_188[3] = '\0';
        local_188[4] = 0;
        local_118._0_8_ = (MemPage *)0x0;
        local_118.pRef = (MemPage *)0x0;
        local_118.apCell = (u8 **)0x0;
        local_118.szCell = (u16 *)0x0;
        local_118.apEnd[0] = (u8 *)0x0;
        local_118.apEnd[1] = (u8 *)0x0;
        local_118.apEnd[2] = (u8 *)0x0;
        local_118.apEnd[3] = (u8 *)0x0;
        local_118.apEnd[4] = (u8 *)0x0;
        local_118.apEnd[5] = (u8 *)0x0;
        local_118.ixNx[0] = 0;
        local_118.ixNx[1] = 0;
        local_118.ixNx[2] = 0;
        local_118.ixNx[3] = 0;
        local_118.ixNx[4] = 0;
        local_118.ixNx[5] = 0;
        if (local_150 != (u8 *)0x0) {
          uVar40 = pCur->hints & 1;
          local_268 = (ulong)uVar40;
          uVar14 = (uint)local_238->nCell + (uint)local_238->nOverflow;
          local_220 = 0;
          if (1 < uVar14) {
            uVar23 = (uint)local_210;
            if (uVar23 == 0) {
              local_220 = 0;
            }
            else {
              if (uVar14 == uVar23) {
                uVar23 = (uVar14 + uVar40) - 2;
              }
              else {
                uVar23 = uVar23 - 1;
              }
              local_220 = (ulong)uVar23;
            }
            uVar14 = 2 - uVar40;
          }
          local_80[0] = (Pager *)(ulong)uVar14;
          iVar15 = (int)local_220;
          uVar40 = (iVar15 - (uint)local_238->nOverflow) + uVar14;
          local_178 = puVar17;
          if (uVar40 == local_238->nCell) {
            uVar42 = (ulong)local_238->hdrOffset + 8;
          }
          else {
            uVar42 = (ulong)(CONCAT11(local_238->aCellIdx[(long)(int)uVar40 * 2],
                                      local_238->aCellIdx[(long)(int)uVar40 * 2 + 1]) &
                            local_238->maskPage);
          }
          local_218 = local_238->pBt;
          local_204 = uVar14 + 1;
          local_a0 = (uint *)(local_238->aData + uVar42);
          uVar40 = *(uint *)(local_238->aData + uVar42);
          PVar44 = uVar40 >> 0x18 | (uVar40 & 0xff0000) >> 8 | (uVar40 & 0xff00) << 8 |
                   uVar40 << 0x18;
          __n = (size_t)(uVar14 * 8);
          uVar40 = iVar15 + -1 + uVar14;
          local_260 = CONCAT44(local_260._4_4_,(iVar15 + uVar14) * 2 + -2);
          local_190 = local_80[0];
          local_248 = (Pager *)(local_1d8 + (long)((long)&local_80[0][-1].zWal + 6) * 4 + 0x24);
          iVar15 = 0;
          pMVar37 = local_238;
          local_22c = PVar44;
          local_228 = pMVar32;
          do {
            if (local_284 == 0) {
              local_284 = getAndInitPage(local_218,PVar44,(MemPage **)(local_1d8 + __n),
                                         (BtCursor *)0x0,0);
            }
            if (local_284 != 0) {
              __n = __n + 8;
LAB_00166fe0:
              uVar40 = 0;
              local_22c = PVar44;
              memset(local_1d8,0,__n);
              uVar23 = local_284;
              goto LAB_0016700a;
            }
            pMVar32 = *(MemPage **)(local_1d8 + __n);
            if ((pMVar32->nFree < 0) && (local_284 = btreeComputeFreeSpace(pMVar32), local_284 != 0)
               ) goto LAB_00166fe0;
            iVar28 = iVar15 + (uint)pMVar32->nCell;
            iVar15 = iVar28 + 4;
            if (__n == 0) goto LAB_001668a6;
            if ((pMVar37->nOverflow == 0) || (uVar40 != pMVar37->aiOvfl[0])) {
              local_270 = (Pager *)CONCAT44(local_270._4_4_,uVar40);
              puVar47 = pMVar37->aData;
              lVar19 = (long)(int)((int)local_260 + (uint)pMVar37->nOverflow * -2);
              uVar12 = CONCAT11(pMVar37->aCellIdx[lVar19],pMVar37->aCellIdx[lVar19 + 1]) &
                       pMVar37->maskPage;
              puVar17 = puVar47 + uVar12;
              *(u8 **)((long)local_80 + __n) = puVar17;
              uVar14 = *(uint *)(puVar47 + uVar12);
              uVar11 = (*pMVar37->xCellSize)(pMVar37,puVar17);
              *(uint *)&local_248->pVfs = (uint)uVar11;
              puVar47 = local_150;
              if (((local_218->btsFlags & 0xc) != 0) &&
                 (iVar28 = (int)puVar17 - *(int *)&pMVar37->aData,
                 (int)(iVar28 + (uint)uVar11) <= (int)local_218->usableSize)) {
                memcpy(local_150 + iVar28,puVar17,(ulong)(uint)uVar11);
                *(u8 **)((long)local_80 + __n) = puVar47 + ((long)puVar17 - (long)local_238->aData);
                pMVar37 = local_238;
              }
              PVar44 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                       uVar14 << 0x18;
              uVar40 = (uint)local_270;
              dropCell(pMVar37,(uint)local_270 - pMVar37->nOverflow,(uint)uVar11,(int *)&local_284);
            }
            else {
              puVar6 = (uint *)pMVar37->apOvfl[0];
              *(uint **)((long)local_80 + __n) = puVar6;
              uVar14 = *puVar6;
              PVar44 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                       uVar14 << 0x18;
              uVar11 = (*pMVar37->xCellSize)(pMVar37,(u8 *)puVar6);
              *(uint *)&local_248->pVfs = (uint)uVar11;
              pMVar37->nOverflow = '\0';
            }
            __n = __n - 8;
            local_260 = CONCAT44(local_260._4_4_,(int)local_260 + -2);
            uVar40 = uVar40 - 1;
            local_248 = (Pager *)((long)&local_248[-1].zWal + 4);
          } while( true );
        }
        uVar14 = 7;
        goto LAB_00167085;
      }
      goto LAB_0016709a;
    }
    uVar14 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12c33);
    goto LAB_001670c9;
  }
  iVar15 = btreeComputeFreeSpace(pMVar32);
  bVar48 = false;
  if (iVar15 == 0) goto LAB_00166220;
LAB_00166628:
  uVar14 = 0;
  goto LAB_001670cb;
LAB_001668a6:
  uVar14 = iVar28 + 7;
  uVar40 = uVar14 & 0x7ffffffc;
  local_22c = PVar44;
  local_118.apCell = (u8 **)sqlite3Malloc((long)(int)(uVar40 * 10 + local_218->pageSize));
  if ((Pager *)local_118.apCell == (Pager *)0x0) {
    local_284 = 7;
LAB_00167008:
    uVar40 = 0;
    uVar23 = local_284;
  }
  else {
    local_278 = (Pager *)(&((Pager *)local_118.apCell)->pVfs + uVar40);
    local_118.szCell = (u16 *)local_278;
    local_180 = (u8 *)((long)&local_278->pVfs + (ulong)uVar40 * 2);
    local_118.pRef = (MemPage *)local_1d8._0_8_;
    local_16c = (uint)*(u8 *)(local_1d8._0_8_ + 8);
    local_258 = (ulong)*(u8 *)(local_1d8._0_8_ + 8) << 2;
    local_200 = (MemPage *)local_1d8._0_8_;
    local_260 = (ulong)*(u8 *)(local_1d8._0_8_ + 2);
    pPVar35 = (Pager *)(ulong)local_204;
    local_a8 = (Pager **)
               (&((Pager *)local_118.apCell)->pVfs + (ulong)(uVar14 >> 2 & 0x1fffffff) * 5);
    pPVar30 = (Pager *)0x0;
    iVar28 = 0;
    iVar15 = local_118.nCell;
    local_280 = (Pager *)local_118.apCell;
    local_250 = pPVar35;
    do {
      lVar19 = *(long *)(local_1d8 + (long)pPVar30 * 8);
      puVar17 = *(u8 **)(lVar19 + 0x50);
      if (*puVar17 == *local_200->aData) {
        local_270 = (Pager *)(ulong)*(ushort *)(lVar19 + 0x18);
        uVar12 = *(ushort *)(lVar19 + 0x1a);
        puVar47 = puVar17 + *(ushort *)(lVar19 + 0x12);
        local_240 = (Pager *)(long)iVar15;
        local_248 = pPVar30;
        memset((u8 *)((long)&local_278->pVfs + (long)local_240 * 2),0,
               (ulong)(((uint)*(ushort *)(lVar19 + 0x18) + (uint)*(byte *)(lVar19 + 0xc)) * 2));
        pPVar30 = local_278;
        bVar1 = *(byte *)(lVar19 + 0xc);
        if (bVar1 != 0) {
          uVar13 = *(ushort *)(lVar19 + 0x1c);
          if ((ushort)local_270 < uVar13) {
            bVar48 = false;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12978);
            local_284 = 0xb;
            pPVar30 = local_248;
            pPVar35 = local_250;
            goto LAB_00166c23;
          }
          if (uVar13 != 0) {
            lVar31 = 0;
            do {
              (&local_280->pVfs)[(long)((long)&local_240->pVfs + lVar31)] =
                   (sqlite3_vfs *)(puVar17 + (uVar12 & CONCAT11(*puVar47,puVar47[1])));
              puVar47 = puVar47 + 2;
              lVar31 = lVar31 + 1;
            } while ((uint)uVar13 != (uint)lVar31);
            iVar15 = iVar15 + (uint)lVar31;
          }
          uVar14 = (uint)bVar1;
          if (bVar1 < 2) {
            uVar14 = 1;
          }
          uVar42 = 0;
          do {
            (&local_280->pVfs)[(long)iVar15 + uVar42] =
                 (sqlite3_vfs *)*(Pager **)(lVar19 + 0x28 + uVar42 * 8);
            uVar42 = uVar42 + 1;
          } while (uVar14 != uVar42);
          iVar15 = iVar15 + (int)uVar42;
          local_118._0_8_ = (MemPage *)CONCAT44(local_118._4_4_,iVar15);
        }
        uVar13 = *(ushort *)(lVar19 + 0x12);
        uVar3 = *(ushort *)(lVar19 + 0x18);
        if (puVar47 < puVar17 + (ulong)uVar3 * 2 + (ulong)uVar13) {
          lVar31 = (long)iVar15;
          lVar24 = 0;
          do {
            puVar20 = puVar47 + lVar24;
            *(u8 **)((long)&local_280->pVfs + lVar24 * 4 + lVar31 * 8) =
                 puVar17 + (CONCAT11(*puVar20,puVar20[1]) & uVar12);
            iVar15 = iVar15 + 1;
            local_118.nCell = iVar15;
            lVar24 = lVar24 + 2;
          } while (puVar20 + 2 < puVar17 + (ulong)uVar3 * 2 + (ulong)uVar13);
        }
        *(int *)((long)local_98 + local_248 * 4) = iVar15;
        if ((local_248 < local_190) && ((char)local_260 == '\0')) {
          uVar14 = *(uint *)(local_1d8 + (long)((long)&(local_248 + -1 + 1)[-1].zWal + 7) * 4 + 0x24
                            ) & 0xffff;
          lVar31 = (long)iVar15;
          *(short *)((long)&local_278->pVfs + lVar31 * 2) =
               (short)*(uint *)(local_1d8 +
                               (long)((long)&(local_248 + -1 + 1)[-1].zWal + 7) * 4 + 0x24);
          puVar17 = local_180 + iVar28;
          iVar28 = iVar28 + uVar14;
          memcpy(puVar17,local_80[(long)((long)&local_248->pVfs + 1)],(ulong)uVar14);
          (&local_280->pVfs)[lVar31] = (sqlite3_vfs *)(puVar17 + local_258);
          uVar12 = *(short *)((long)&pPVar30->pVfs + lVar31 * 2) - (short)local_258;
          *(ushort *)((long)&pPVar30->pVfs + lVar31 * 2) = uVar12;
          if (*(char *)(lVar19 + 8) == '\0') {
            *(undefined4 *)&((Pager *)(puVar17 + local_258))->pVfs =
                 *(undefined4 *)(*(long *)(lVar19 + 0x50) + 8);
          }
          else if (uVar12 < 4) {
            puVar17 = (u8 *)((long)iVar28 + (long)local_a8);
            do {
              *puVar17 = '\0';
              uVar12 = *(short *)((long)&pPVar30->pVfs + lVar31 * 2) + 1;
              *(ushort *)((long)&pPVar30->pVfs + lVar31 * 2) = uVar12;
              puVar17 = puVar17 + 1;
              iVar28 = iVar28 + 1;
            } while (uVar12 < 4);
          }
          iVar15 = iVar15 + 1;
          local_118.nCell = iVar15;
        }
        bVar48 = true;
        pPVar30 = local_248;
        pPVar35 = local_250;
      }
      else {
        bVar48 = false;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12960);
        local_284 = 0xb;
      }
LAB_00166c23:
      if (!bVar48) goto LAB_00167008;
      pPVar30 = (Pager *)((long)&pPVar30->pVfs + 1);
    } while (pPVar30 != pPVar35);
    local_180 = (u8 *)(local_258 & 0xffff);
    local_248 = (Pager *)CONCAT44(local_248._4_4_,
                                  local_218->usableSize + (uint)(ushort)local_258 + -0xc);
    pPVar30 = (Pager *)0x0;
    iVar15 = 0;
    do {
      pPVar39 = *(Pager **)(local_1d8 + (long)pPVar30 * 8);
      local_118.apEnd[iVar15] = (u8 *)pPVar39->sjfd;
      uVar14 = *(uint *)((long)local_98 + pPVar30 * 4);
      local_118.ixNx[iVar15] = uVar14;
      iVar28 = 0;
      if ((iVar15 != 0) &&
         (iVar28 = iVar15 + -1, uVar14 != local_118.ixNx[(long)iVar15 + 0xffffffffffffffff])) {
        iVar28 = iVar15;
      }
      iVar15 = iVar28;
      if ((int)local_260 == 0) {
        iVar15 = iVar28 + 1;
        local_118.apEnd[(long)iVar28 + 1] = local_238->aDataEnd;
        local_118.ixNx[(long)iVar28 + 1] = uVar14 + 1;
      }
      *(int *)(local_1d8 + (long)((long)&(pPVar30 + -1 + 1)[-1].zWal + 7) * 4 + 0x24) =
           (int)local_248 - *(int *)&pPVar39->memVfs;
      if (pPVar39->fullSync != '\0') {
        uVar42 = 0;
        do {
          uVar12 = (*(code *)pPVar39->aSavepoint)(pPVar39);
          *(uint *)(local_1d8 + (long)((long)&(pPVar30 + -1 + 1)[-1].zWal + 7) * 4 + 0x24) =
               (uint)uVar12 +
               *(int *)(local_1d8 + (long)((long)&(pPVar30 + -1 + 1)[-1].zWal + 7) * 4 + 0x24) + 2;
          uVar42 = uVar42 + 1;
        } while (uVar42 < pPVar39->fullSync);
      }
      local_1f4[(long)((long)&pPVar30[-1].zWal + 7)] = uVar14;
      pPVar30 = (Pager *)((long)&pPVar30->pVfs + 1);
      iVar15 = iVar15 + 1;
    } while (pPVar30 != pPVar35);
    local_258 = CONCAT44(local_258._4_4_,local_284);
    local_278 = (Pager *)CONCAT44(local_278._4_4_,local_118.nCell);
    local_280 = (Pager *)(long)local_118.nCell;
    local_240 = (Pager *)-(long)local_280;
    uVar33 = 0;
    uVar42 = (ulong)local_204;
    local_270 = (Pager *)local_118.szCell;
    pPVar30 = (Pager *)local_118.szCell;
    do {
      iVar15 = *(int *)(local_1d8 + (uVar33 - 1) * 4 + 0x24);
      if ((int)local_248 < iVar15) {
        local_250 = (Pager *)CONCAT44(local_250._4_4_,(int)uVar33 + 2);
        do {
          if ((long)(int)uVar42 <= (long)(uVar33 + 1)) {
            if (3 < uVar33) {
              *(int *)(local_1d8 + (uVar33 - 1) * 4 + 0x24) = iVar15;
              bVar48 = false;
              local_258 = CONCAT44(local_258._4_4_,0xb);
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x129dd);
              uVar42 = (ulong)local_250 & 0xffffffff;
              pPVar30 = local_270;
              goto LAB_00166f34;
            }
            *(undefined4 *)(local_1d8 + uVar33 * 4 + 0x24) = 0;
            local_1f4[uVar33] = (uint)local_278;
            uVar42 = (ulong)local_250 & 0xffffffff;
          }
          uVar14 = local_1f4[uVar33 - 1];
          lVar19 = (long)(int)uVar14;
          pPVar39 = (Pager *)(lVar19 + -1);
          uVar12 = *(ushort *)((long)pPVar30 + lVar19 * 2 + -2);
          if (uVar12 == 0) {
            uVar12 = computeCellSize(&local_118,(uint)pPVar39);
            pPVar30 = local_270;
          }
          iVar28 = uVar12 + 2;
          if ((int)local_260 == 0) {
            iVar28 = 0;
            if ((int)uVar14 < (int)(uint)local_278) {
              uVar13 = *(ushort *)((long)&pPVar30->pVfs + lVar19 * 2);
              if (uVar13 == 0) {
                uVar13 = computeCellSize(&local_118,uVar14);
                pPVar30 = local_270;
              }
              iVar28 = uVar13 + 2;
            }
          }
          *(int *)(local_1d8 + uVar33 * 4 + 0x24) = *(int *)(local_1d8 + uVar33 * 4 + 0x24) + iVar28
          ;
          iVar15 = iVar15 - (uVar12 + 2);
          local_1f4[uVar33 - 1] = (uint)pPVar39;
        } while ((int)local_248 < iVar15);
      }
      *(int *)(local_1d8 + (uVar33 - 1) * 4 + 0x24) = iVar15;
      uVar14 = local_1f4[uVar33 - 1];
      if ((int)uVar14 < (int)(uint)local_278) {
        bVar48 = true;
        lVar19 = (long)(int)uVar14;
        do {
          pPVar39 = (Pager *)(ulong)uVar14;
          lVar31 = lVar19 + 1;
          uVar12 = *(ushort *)((long)&pPVar30->pVfs + lVar19 * 2);
          if (uVar12 == 0) {
            uVar12 = computeCellSize(&local_118,uVar14);
            pPVar30 = local_270;
          }
          iVar15 = uVar12 + 2;
          if ((int)local_248 < *(int *)(local_1d8 + (uVar33 - 1) * 4 + 0x24) + iVar15) {
            if (bVar48) {
              if (uVar33 == 0) {
                iVar15 = 0;
              }
              else {
                iVar15 = *(int *)((long)&local_200 + uVar33 * 4 + 4);
              }
              bVar48 = true;
              if ((int)uVar14 <= iVar15) {
                bVar48 = false;
                local_258 = CONCAT44(local_258._4_4_,0xb);
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x129fe);
                pPVar30 = local_270;
              }
              goto LAB_00166f34;
            }
            break;
          }
          *(int *)(local_1d8 + (uVar33 - 1) * 4 + 0x24) =
               *(int *)(local_1d8 + (uVar33 - 1) * 4 + 0x24) + iVar15;
          local_1f4[uVar33 - 1] = uVar14 + 1;
          if (((int)local_260 == 0) && (iVar15 = 0, lVar31 < (long)local_280)) {
            uVar12 = *(ushort *)((long)&pPVar30->pVfs + lVar19 * 2 + 2);
            if (uVar12 == 0) {
              pPVar39 = (Pager *)(ulong)(uVar14 + 1);
              uVar12 = computeCellSize(&local_118,uVar14 + 1);
              pPVar30 = local_270;
            }
            iVar15 = uVar12 + 2;
          }
          *(int *)(local_1d8 + uVar33 * 4 + 0x24) = *(int *)(local_1d8 + uVar33 * 4 + 0x24) - iVar15
          ;
          bVar48 = lVar31 < (long)local_280;
          lVar19 = lVar31;
          uVar14 = uVar14 + 1;
        } while ((u8 *)((long)&local_240->pVfs + lVar31) != (u8 *)0x0);
      }
      uVar42 = (ulong)((int)uVar33 + 1);
      bVar48 = true;
LAB_00166f34:
      if (!bVar48) {
        local_284 = (uint)local_258;
        goto LAB_00167008;
      }
      uVar33 = uVar33 + 1;
    } while ((long)uVar33 < (long)(int)uVar42);
    local_284 = (uint)local_258;
    local_250 = (Pager *)(ulong)((int)uVar42 - 1);
    iVar15 = (int)local_260;
    pPVar35 = pPVar30;
    pPVar38 = local_250;
    local_258 = uVar42;
    do {
      if ((int)pPVar38 < 1) {
        local_200 = (MemPage *)CONCAT44(local_200._4_4_,(uint)*local_200->aData);
        if (0 < (int)local_258) {
          uVar14 = (int)local_210 - (int)local_220;
          local_270 = (Pager *)(local_258 & 0xffffffff);
          pPVar35 = (Pager *)0x0;
          uVar42 = 0;
          pPVar30 = pPVar39;
          goto LAB_001672a1;
        }
        uVar42 = 0;
        goto LAB_00167665;
      }
      iVar28 = *(int *)(local_1d8 + (long)((long)&pPVar38[-1].zWal + 6) * 4 + 0x24);
      iVar29 = *(int *)(local_1d8 + (long)((long)&(pPVar38 + -1 + 1)[-1].zWal + 7) * 4 + 0x24);
      iVar46 = *(int *)((long)&local_200 + (long)pPVar38 * 4 + 4);
      lVar19 = (long)iVar46 - (local_260 & 0xffffffff);
      if (*(short *)((long)pPVar35 + lVar19 * 2) == 0) {
        computeCellSize(&local_118,(int)lVar19);
        pPVar35 = local_270;
      }
      local_280 = (Pager *)(ulong)((uint)(pPVar38 == local_250) * 2 - 2);
      lVar19 = (long)iVar46 + 1;
      pPVar39 = (Pager *)(ulong)(iVar46 - 1);
      local_240 = pPVar38;
      do {
        uVar14 = (uint)pPVar39;
        if (*(short *)((long)pPVar35 + lVar19 * 2 + -4) == 0) {
          computeCellSize(&local_118,uVar14);
          pPVar35 = local_270;
        }
        if ((iVar29 != 0) &&
           (((char)local_268 != '\0' ||
            ((int)(((int)local_280 + iVar28) - (uint)*(ushort *)((long)pPVar35 + lVar19 * 2 + -4)) <
             (int)((uint)*(ushort *)((long)pPVar30 + lVar19 * 2 + (-2 - (ulong)(uint)(iVar15 * 2)))
                   + iVar29 + 2))))) break;
        iVar29 = iVar29 + (uint)*(ushort *)
                                 ((long)pPVar30 + lVar19 * 2 + (-2 - (ulong)(uint)(iVar15 * 2))) + 2
        ;
        iVar28 = (iVar28 - (uint)*(ushort *)((long)pPVar35 + lVar19 * 2 + -4)) + -2;
        local_1f4[(long)((long)&pPVar38[-1].zWal + 6)] = uVar14;
        lVar19 = lVar19 + -1;
        pPVar39 = (Pager *)(ulong)(uVar14 - 1);
      } while (1 < lVar19);
      *(int *)(local_1d8 + (long)((long)&(local_240 + -1 + 1)[-1].zWal + 7) * 4 + 0x24) = iVar29;
      *(int *)(local_1d8 + (long)((long)&pPVar38[-1].zWal + 6) * 4 + 0x24) = iVar28;
      pPVar27 = pPVar38 + -1;
      uVar14 = 0;
      if (local_240 != (Pager *)0x1) {
        uVar14 = local_1f4[(ulong)((int)local_240 - 2) - 1];
      }
      pPVar38 = (Pager *)((long)&pPVar38[-1].zWal + 7);
    } while ((int)uVar14 < (int)local_1f4[(long)((long)&pPVar27->zWal + 6)]);
    uVar40 = 0;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12a28);
    local_284 = 0xb;
    uVar23 = local_284;
  }
  goto LAB_0016700a;
  while (pPVar35 = (Pager *)((long)&pPVar35->pVfs + 1), pPVar30 = pPVar39, local_270 != pPVar35) {
LAB_001672a1:
    pBVar5 = local_218;
    if (local_190 < pPVar35) {
      PVar44 = 1;
      if ((char)local_268 == '\0') {
        PVar44 = local_22c;
      }
      local_284 = allocateBtreePage(local_218,(MemPage **)&local_168,&local_22c,PVar44,'\0');
      pPVar39 = (Pager *)local_168.nKey;
      if (local_284 == 0) {
        zeroPage((MemPage *)local_168.nKey,(int)local_200);
        local_140[(long)((long)&pPVar35[-1].zWal + 7)] = (ulong)pPVar39;
        uVar42 = (ulong)((int)uVar42 + 1);
        *(uint *)((long)local_98 + pPVar35 * 4) = (uint)local_278;
        if ((pBVar5->autoVacuum == '\0') ||
           (ptrmapPut(pBVar5,*(Pgno *)((long)&pPVar39->pVfs + 4),'\x05',local_238->pgno,
                      (int *)&local_284), pPVar30 = pPVar39, local_284 == 0)) goto LAB_001673f8;
      }
      bVar48 = false;
      pPVar39 = pPVar30;
    }
    else {
      pPVar39 = *(Pager **)(local_1d8 + (long)pPVar35 * 8);
      local_140[(long)((long)&pPVar35[-1].zWal + 7)] = (ulong)pPVar39;
      local_168.nKey = (i64)pPVar39;
      *(undefined8 *)(local_1d8 + (long)pPVar35 * 8) = 0;
      local_284 = sqlite3PagerWrite((PgHdr *)pPVar39->pBackup);
      if ((((Pager *)(ulong)uVar14 == pPVar35) + 1 !=
           (int)*(i16 *)((long)&pPVar39->pBackup->nRemaining + 2)) && (local_284 == 0)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
        local_284 = 0xb;
      }
      uVar42 = (ulong)((int)uVar42 + 1);
      if (local_284 == 0) {
LAB_001673f8:
        bVar48 = true;
      }
      else {
        bVar48 = false;
      }
    }
    if (!bVar48) {
      uVar40 = (uint)uVar42;
      uVar23 = local_284;
      goto LAB_0016700a;
    }
  }
LAB_00167665:
  iVar15 = (int)uVar42;
  if (0 < iVar15) {
    uVar33 = 0;
    do {
      auStack_48[uVar33] = *(uint *)(local_140[uVar33 - 1] + 4);
      uVar33 = uVar33 + 1;
    } while (uVar42 != uVar33);
  }
  local_258 = CONCAT44(local_258._4_4_,iVar15 - 1U);
  pMVar32 = local_228;
  local_268 = uVar42;
  if (1 < iVar15) {
    pMVar37 = (MemPage *)(ulong)(iVar15 - 1U);
    uVar43 = 1;
    uVar33 = 0;
    local_210 = pMVar37;
    do {
      uVar25 = uVar33 & 0xffffffff;
      uVar18 = uVar43;
      do {
        uVar14 = (uint)uVar18;
        if (*(uint *)(local_140[(long)(int)(uint)uVar25 + -1] + 4) <=
            *(uint *)(local_140[uVar18 - 1] + 4)) {
          uVar14 = (uint)uVar25;
        }
        uVar18 = uVar18 + 1;
        uVar25 = (ulong)uVar14;
      } while (uVar42 != uVar18);
      if (uVar33 != uVar14) {
        pPVar30 = (Pager *)local_140[uVar33 - 1];
        uVar40 = *(Pgno *)((long)&pPVar30->pVfs + 4);
        pPVar39 = (Pager *)(ulong)uVar40;
        uVar18 = local_140[(long)(int)uVar14 + -1];
        local_270 = (Pager *)CONCAT44(local_270._4_4_,*(undefined4 *)(uVar18 + 4));
        uVar14 = (uint)sqlite3PendingByte / local_218->pageSize;
        psVar7 = pPVar30->pBackup;
        local_240 = (Pager *)CONCAT62(local_240._2_6_,(u16)psVar7->nRemaining);
        uVar11 = *(u16 *)(*(long *)(uVar18 + 0x70) + 0x34);
        local_280 = (Pager *)CONCAT62(local_280._2_6_,uVar11);
        *(u16 *)&psVar7->nRemaining = uVar11;
        local_250 = pPVar30;
        sqlite3PcacheMove((PgHdr *)psVar7,uVar14 + 1);
        p = *(PgHdr **)(uVar18 + 0x70);
        p->flags = (u16)local_240;
        sqlite3PcacheMove(p,uVar40);
        psVar7 = pPVar30->pBackup;
        *(u16 *)&psVar7->nRemaining = (u16)local_280;
        PVar44 = (uint)local_270;
        sqlite3PcacheMove((PgHdr *)psVar7,(uint)local_270);
        *(Pgno *)((long)&local_250->pVfs + 4) = PVar44;
        *(uint *)(uVar18 + 4) = uVar40;
        pMVar32 = local_228;
        pMVar37 = local_210;
      }
      uVar33 = uVar33 + 1;
      uVar43 = uVar43 + 1;
    } while ((MemPage *)uVar33 != pMVar37);
  }
  uVar42 = local_140[(long)(int)(uint)local_258 + -1];
  uVar14 = *(uint *)(uVar42 + 4);
  *local_a0 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar40 = (uint)local_268;
  if ((((ulong)local_200 & 8) == 0) && (local_204 != uVar40)) {
    puVar21 = (undefined8 *)local_1d8;
    if ((int)local_204 < (int)uVar40) {
      puVar21 = &local_148;
    }
    *(undefined4 *)(*(long *)(uVar42 + 0x50) + 8) =
         *(undefined4 *)(*(long *)(puVar21[(long)local_190] + 0x50) + 8);
  }
  if (local_218->autoVacuum != '\0') {
    if (0 < (int)(uint)local_278) {
      bVar48 = (int)local_260 == 0;
      pPVar35 = (Pager *)CONCAT44(local_148._4_4_,(uint)local_148);
      pPVar38 = (Pager *)(ulong)((uint)*(ushort *)&pPVar35->setSuper + (uint)pPVar35->fullSync);
      pPVar39 = (Pager *)0x0;
      iVar15 = 0;
      local_278 = (Pager *)((ulong)local_278 & 0xffffffff00000000);
      pPVar30 = pPVar35;
      do {
        if (pPVar39 == pPVar38) {
          lVar19 = (long)iVar15;
          puVar22 = (ulong *)(local_1d8 + lVar19 * 8 + 8);
          puVar26 = local_140 + lVar19;
          do {
            lVar19 = lVar19 + 1;
            puVar34 = puVar22;
            if (lVar19 < (int)uVar40) {
              puVar34 = puVar26;
            }
            pPVar30 = (Pager *)*puVar34;
            pPVar38 = (Pager *)(ulong)((int)pPVar38 + (uint)bVar48 +
                                       (uint)*(ushort *)&pPVar30->setSuper + (uint)pPVar30->fullSync
                                      );
            iVar15 = iVar15 + 1;
            puVar22 = puVar22 + 1;
            puVar26 = puVar26 + 1;
          } while (pPVar39 == pPVar38);
        }
        pPVar27 = ((Pager **)local_118.apCell)[(long)pPVar39];
        lVar19 = (long)(int)(uint)local_278;
        if (pPVar39 == (Pager *)(ulong)local_1f4[lVar19 + -1]) {
          local_278 = (Pager *)CONCAT44(local_278._4_4_,(uint)local_278 + 1);
          pPVar35 = (Pager *)local_140[lVar19];
          if ((int)local_260 != 0) goto LAB_001678e6;
          iVar28 = 0x32;
        }
        else {
LAB_001678e6:
          if (((((int)local_268 <= iVar15) ||
               (*(Pgno *)((long)&pPVar35->pVfs + 4) != auStack_48[iVar15])) ||
              (pPVar27 < (Pager *)pPVar30->jfd)) || (iVar28 = 0, (Pager *)pPVar30->sjfd <= pPVar27))
          {
            local_270 = pPVar35;
            if ((char)local_16c == '\0') {
              uVar14 = *(uint *)&pPVar27->pVfs;
              local_280 = pPVar27;
              ptrmapPut(local_218,
                        uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                        uVar14 << 0x18,'\x05',*(Pgno *)((long)&pPVar35->pVfs + 4),(int *)&local_284)
              ;
              pPVar27 = local_280;
            }
            uVar12 = *(ushort *)((long)(Pager **)local_118.szCell + (long)pPVar39 * 2);
            if (uVar12 == 0) {
              local_280 = pPVar27;
              uVar12 = computeCellSize(&local_118,(int)pPVar39);
              pPVar27 = local_280;
            }
            if (*(ushort *)&local_270->tempFile < uVar12) {
              ptrmapPutOvflPtr((MemPage *)local_270,(MemPage *)pPVar30,(u8 *)pPVar27,
                               (int *)&local_284);
            }
            iVar28 = (uint)(local_284 != 0) << 2;
            pPVar35 = local_270;
          }
        }
        if ((iVar28 != 0x32) && (iVar28 != 0)) goto LAB_001679cd;
        pPVar39 = (Pager *)((long)&pPVar39->pVfs + 1);
      } while ((long)pPVar39 < (long)local_118.nCell);
    }
    iVar28 = 0;
LAB_001679cd:
    if (iVar28 == 4) {
LAB_001681a7:
      uVar40 = (uint)local_268;
      uVar23 = local_284;
      goto LAB_0016700a;
    }
    uVar40 = (uint)local_268;
    pMVar32 = local_228;
    puVar17 = local_178;
    pCur = local_198;
    uVar14 = (uint)pPVar39;
    if (iVar28 != 0) goto LAB_00167085;
  }
  if (1 < (int)uVar40) {
    local_278 = (Pager *)local_118.apCell;
    local_280 = (Pager *)local_118.szCell;
    local_240 = (Pager *)(local_258 & 0xffffffff);
    pPVar30 = (Pager *)0x0;
    iVar15 = 0;
    do {
      local_270 = (Pager *)local_140[(long)((long)&pPVar30[-1].zWal + 7)];
      uVar14 = local_1f4[(long)((long)&pPVar30[-1].zWal + 7)];
      lVar19 = (long)(int)uVar14;
      pPVar35 = (Pager *)(&local_278->pVfs)[lVar19];
      uVar12 = *(ushort *)((long)&local_280->pVfs + lVar19 * 2);
      uVar40 = (uint)uVar12 + (int)local_180;
      pPVar38 = (Pager *)(local_150 + iVar15);
      pPVar39 = pPVar38;
      if (local_270->exclusiveMode == '\0') {
        *(undefined4 *)&local_270->jfd[1].pMethods = *(undefined4 *)&pPVar35->pVfs;
      }
      else if ((int)local_260 == 0) {
        pPVar35 = (Pager *)((long)&pPVar35[-1].zWal + 4);
        if (uVar12 == 4) {
          uVar11 = (*local_238->xCellSize)(local_238,(u8 *)pPVar35);
          uVar40 = (uint)uVar11;
        }
      }
      else {
        uVar14 = uVar14 - 1;
        (*(code *)*(Btree **)&local_270->nSavepoint)
                  ((MemPage *)local_270,*(u8 **)((long)local_278 + lVar19 * 8 + -8),&local_168);
        iVar28 = sqlite3PutVarint((uchar *)((long)&pPVar38->pVfs + 4),local_168.nKey);
        uVar40 = iVar28 + 4;
        pPVar39 = (Pager *)0x0;
        pPVar35 = pPVar38;
      }
      pMVar32 = local_228;
      uVar42 = 0;
      do {
        uVar33 = uVar42;
        if (5 < uVar33) break;
        uVar42 = uVar33 + 1;
      } while (local_118.ixNx[uVar33] <= (int)uVar14);
      if ((pPVar35 <= (Pager *)local_118.apEnd[uVar33]) &&
         ((Pager *)local_118.apEnd[uVar33] < (Pager *)((long)&pPVar35->pVfs + (long)(int)uVar40))) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b11);
        local_284 = 0xb;
        goto LAB_001681a7;
      }
      insertCell(local_238,(int)local_220 + (int)pPVar30,(u8 *)pPVar35,uVar40,(u8 *)pPVar39,
                 *(Pgno *)((long)&local_270->pVfs + 4),(int *)&local_284);
      if (local_284 != 0) goto LAB_001681a7;
      iVar15 = iVar15 + uVar40;
      pPVar30 = (Pager *)((long)&pPVar30->pVfs + 1);
    } while (pPVar30 != local_240);
  }
  uVar41 = 1 - (int)local_268;
  uVar42 = local_268;
  uVar23 = local_284;
  if ((int)uVar41 < (int)local_268) {
    local_258 = CONCAT44(local_258._4_4_,(uint)((int)local_260 == 0));
    local_180 = (u8 *)CONCAT44(local_180._4_4_,local_118.nCell);
    local_a8 = (Pager **)CONCAT44(local_a8._4_4_,local_1f8);
    local_190 = (Pager *)local_118.szCell;
    local_210 = local_118.pRef;
    local_270 = (Pager *)local_118.apCell;
    puVar17 = local_178;
    pCur = local_198;
    do {
      uVar14 = -uVar41;
      if (0 < (int)uVar41) {
        uVar14 = uVar41;
      }
      uVar33 = (ulong)uVar14;
      iVar15 = 0x3d;
      if ((local_188[uVar33] == '\0') &&
         ((-1 < (int)uVar41 ||
          (iVar15 = 0,
          *(int *)((long)&local_200 + (long)(int)uVar14 * 4 + 4) <=
          *(int *)((long)local_98 + ((long)(int)uVar14 + -1) * 4))))) {
        if (uVar41 == 0) {
          local_280 = (Pager *)0x0;
          iVar15 = 0;
          uVar40 = (uint)local_a8;
        }
        else {
          iVar15 = (int)local_180;
          if (uVar14 <= (uint)local_80[0]) {
            iVar15 = *(int *)((long)local_98 + ((long)(int)uVar14 + -1) * 4) + (uint)local_258;
          }
          uVar40 = *(int *)((long)&local_200 + (long)(int)uVar14 * 4 + 4) + (uint)local_258;
          local_280 = (Pager *)(ulong)uVar40;
          uVar40 = local_1f4[uVar33 - 1] - uVar40;
        }
        local_260 = (ulong)uVar40;
        pPVar30 = (Pager *)local_140[uVar33 - 1];
        local_200 = (MemPage *)pPVar30->jfd;
        local_220 = (ulong)pPVar30->journalMode;
        local_250 = (Pager *)((long)&((Bitvec *)pPVar30->journalOff)->iSize +
                             (long)(int)(uVar40 * 2));
        uVar12 = *(ushort *)&pPVar30->setSuper;
        uVar45 = (uint)uVar12;
        bVar1 = pPVar30->fullSync;
        iVar28 = (int)local_280;
        local_a0 = (uint *)(ulong)(uint)(iVar15 - iVar28);
        local_240 = (Pager *)CONCAT44(local_240._4_4_,iVar15);
        uVar40 = uVar45;
        local_278 = pPVar30;
        if (iVar15 < iVar28) {
          iVar28 = pageFreeArray((MemPage *)pPVar30,iVar15,iVar28 - iVar15,&local_118);
          uVar40 = (uint)uVar12 - iVar28;
          if ((int)(uint)uVar12 < iVar28) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1274a,
                        "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
            uVar40 = uVar45;
          }
          else {
            memmove((Bitvec *)pPVar30->journalOff,
                    (u8 *)((long)&((Bitvec *)pPVar30->journalOff)->iSize + (long)(iVar28 * 2)),
                    (ulong)(uVar45 * 2));
          }
          uVar23 = 0xb;
          pPVar30 = local_278;
          uVar42 = local_268;
          iVar15 = (int)local_240;
          if (iVar28 <= (int)uVar45) goto LAB_00167d63;
        }
        else {
LAB_00167d63:
          iVar29 = uVar45 + iVar15 + (uint)bVar1;
          iVar28 = (int)local_260 + (int)local_280;
          iVar46 = iVar29 - iVar28;
          if (iVar46 != 0 && iVar28 <= iVar29) {
            iVar15 = pageFreeArray((MemPage *)local_278,iVar28,iVar46,&local_118);
            uVar40 = uVar40 - iVar15;
            iVar15 = (int)local_240;
          }
          uVar12 = *(ushort *)((long)local_200->aiOvfl + (local_220 - 0x17));
          local_168.nKey =
               (long)local_200->aiOvfl +
               ((ulong)((ushort)(uVar12 << 8 | uVar12 >> 8) - 1 & 0xffff) - 0x1b);
          uVar43 = local_260;
          pMVar32 = local_210;
          if ((local_250 <= (ulong)local_168.nKey) &&
             ((ulong)local_168.nKey <= (Pager *)local_278->sjfd)) {
            if ((int)local_280 < iVar15) {
              iVar15 = (int)local_a0;
              if ((int)local_260 <= (int)local_a0) {
                iVar15 = (int)local_260;
              }
              pCellptr = (Bitvec *)local_278->journalOff;
              memmove((u8 *)((long)&pCellptr->iSize + (long)(iVar15 * 2)),pCellptr,
                      (long)(int)(uVar40 * 2));
              pMVar32 = local_210;
              iVar28 = pageInsertArray((MemPage *)local_278,(u8 *)local_250,(u8 **)&local_168,
                                       (u8 *)pCellptr,(int)local_280,iVar15,&local_118);
              uVar43 = local_260;
              if (iVar28 != 0) goto LAB_00167fb8;
              uVar40 = iVar15 + uVar40;
              iVar15 = (int)local_240;
            }
            iVar28 = (int)local_260;
            pPVar30 = local_278;
            if (local_278->fullSync != '\0') {
              uVar18 = 0;
              uVar43 = local_260;
              do {
                lVar19 = (long)iVar15 +
                         (ulong)*(ushort *)((long)pPVar30->dbFileVers + uVar18 * 2 + -0x6c);
                iVar29 = (int)lVar19;
                iVar28 = iVar29 - (int)local_280;
                bVar48 = true;
                if ((-1 < iVar28) && (iVar28 < (int)uVar43)) {
                  puVar17 = (u8 *)((long)&((Bitvec *)pPVar30->journalOff)->iSize +
                                  (ulong)(uint)(iVar28 * 2));
                  if (uVar40 - iVar28 != 0 && iVar28 <= (int)uVar40) {
                    memmove(puVar17 + 2,puVar17,(long)(int)((uVar40 - iVar28) * 2));
                  }
                  if (*(short *)((long)&local_190->pVfs + lVar19 * 2) == 0) {
                    computeCellSize(&local_118,iVar29);
                  }
                  uVar40 = uVar40 + 1;
                  iVar15 = pageInsertArray((MemPage *)local_278,(u8 *)local_250,(u8 **)&local_168,
                                           puVar17,iVar29,1,&local_118);
                  bVar48 = iVar15 == 0;
                  uVar43 = local_260;
                  pPVar30 = local_278;
                  uVar42 = local_268;
                  iVar15 = (int)local_240;
                }
                iVar28 = (int)uVar43;
                pMVar32 = local_210;
                if (!bVar48) goto LAB_00167fb8;
                uVar18 = uVar18 + 1;
              } while (uVar18 < pPVar30->fullSync);
            }
            iVar15 = pageInsertArray((MemPage *)local_278,(u8 *)local_250,(u8 **)&local_168,
                                     (u8 *)((long)&((Bitvec *)pPVar30->journalOff)->iSize +
                                           (long)(int)(uVar40 * 2)),uVar40 + (int)local_280,
                                     iVar28 - uVar40,&local_118);
            uVar43 = local_260;
            if (iVar15 == 0) {
              *(u16 *)&local_278->setSuper = (u16)local_260;
              local_278->fullSync = '\0';
              *(char *)((long)local_200->aiOvfl + (local_220 - 0x19)) = (char)(local_260 >> 8);
              *(u8 *)((long)local_200->aiOvfl + (local_220 - 0x18)) = local_278->setSuper;
              uVar12 = (ushort)((uint)local_168.nKey - (int)local_200);
              *(ushort *)((long)local_200->aiOvfl + (local_220 - 0x17)) = uVar12 << 8 | uVar12 >> 8;
              uVar23 = 0;
              pPVar30 = local_278;
              goto LAB_0016801b;
            }
          }
LAB_00167fb8:
          pPVar30 = local_190;
          iVar15 = (int)uVar43;
          if (0 < iVar15) {
            lVar19 = (long)(int)local_280 * 2;
            iVar28 = iVar15 + 1;
            do {
              if (*(short *)((long)&pPVar30->pVfs + lVar19) == 0) {
                uVar11 = (*pMVar32->xCellSize)
                                   (pMVar32,*(u8 **)((long)&local_270->pVfs + lVar19 * 4));
                *(u16 *)((long)&pPVar30->pVfs + lVar19) = uVar11;
                uVar43 = local_260;
              }
              iVar15 = (int)uVar43;
              lVar19 = lVar19 + 2;
              iVar28 = iVar28 + -1;
            } while (1 < iVar28);
          }
          pPVar30 = local_278;
          uVar23 = rebuildPage(&local_118,(int)local_280,iVar15,(MemPage *)local_278);
          uVar42 = local_268;
        }
LAB_0016801b:
        iVar15 = 4;
        pMVar32 = local_228;
        puVar17 = local_178;
        pCur = local_198;
        if (uVar23 == 0) {
          local_188[uVar33] = '\x01';
          *(int *)&pPVar30->memVfs = (int)local_248 - *(int *)(local_1d8 + (uVar33 - 1) * 4 + 0x24);
          iVar15 = 0;
          puVar17 = local_178;
        }
      }
      uVar40 = (uint)uVar42;
      if ((iVar15 != 0) && (iVar15 != 0x3d)) {
        local_284 = uVar23;
        if (iVar15 != 4) goto LAB_00167085;
        goto LAB_0016700a;
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 != uVar40);
  }
  pBVar5 = local_218;
  pMVar32 = local_238;
  uVar40 = (uint)uVar42;
  local_284 = uVar23;
  if ((((char)local_60 == '\x01') && (local_238->nCell == 0)) &&
     (pMVar37 = (MemPage *)CONCAT44(local_148._4_4_,(uint)local_148),
     (int)(uint)local_238->hdrOffset <= pMVar37->nFree)) {
    local_284 = defragmentPage(pMVar37,-1);
    copyNodeContent(pMVar37,pMVar32,(int *)&local_284);
    if (local_284 == 0) {
      local_284 = freePage2(pMVar37->pBt,pMVar37,pMVar37->pgno);
    }
  }
  else if (((0 < (int)uVar40) && (local_218->autoVacuum != '\0')) && ((char)local_16c == '\0')) {
    uVar33 = 0;
    do {
      uVar14 = *(uint *)(*(long *)(local_140[uVar33 - 1] + 0x50) + 8);
      ptrmapPut(pBVar5,uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                       uVar14 << 0x18,'\x05',*(Pgno *)(local_140[uVar33 - 1] + 4),(int *)&local_284)
      ;
      uVar33 = uVar33 + 1;
    } while ((uVar42 & 0xffffffff) != uVar33);
  }
  iVar15 = (int)local_80[0];
  uVar23 = local_284;
  if ((int)uVar40 <= iVar15) {
    lVar19 = 0;
    do {
      if (uVar23 == 0) {
        pMVar32 = *(MemPage **)(local_1d8 + lVar19 * 8 + (long)(int)uVar40 * 8);
        uVar23 = freePage2(pMVar32->pBt,pMVar32,pMVar32->pgno);
      }
      lVar19 = lVar19 + 1;
    } while ((iVar15 - uVar40) + 1 != (int)lVar19);
  }
LAB_0016700a:
  local_284 = uVar23;
  if ((Pager *)local_118.apCell != (Pager *)0x0) {
    sqlite3_free(local_118.apCell);
  }
  puVar17 = local_178;
  pCur = local_198;
  uVar42 = (ulong)local_204;
  uVar33 = 0;
  do {
    if (*(long *)(local_1d8 + uVar33 * 8) != 0) {
      sqlite3PagerUnrefNotNull(*(DbPage **)(*(long *)(local_1d8 + uVar33 * 8) + 0x70));
    }
    uVar33 = uVar33 + 1;
  } while (uVar42 != uVar33);
  pMVar32 = local_228;
  uVar14 = local_284;
  if (0 < (int)uVar40) {
    uVar42 = 0;
    do {
      if (local_140[uVar42 - 1] != 0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)(local_140[uVar42 - 1] + 0x70));
      }
      uVar42 = uVar42 + 1;
      pMVar32 = local_228;
      uVar14 = local_284;
    } while (uVar40 != uVar42);
  }
LAB_00167085:
  puVar47 = local_150;
  if (puVar17 != (u8 *)0x0) {
    pcache1Free(puVar17);
    puVar47 = local_150;
  }
LAB_0016709a:
  pMVar32->nOverflow = '\0';
  if (pMVar32 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar32->pDbPage);
  }
  cVar10 = pCur->iPage + -1;
  pCur->iPage = cVar10;
  pCur->pPage = pCur->apPage[cVar10];
LAB_001670c9:
  bVar48 = true;
  puVar17 = puVar47;
LAB_001670cb:
  if ((!bVar48) || (uVar14 != 0)) {
    if (puVar17 != (u8 *)0x0) {
      pcache1Free(puVar17);
    }
    return uVar14;
  }
  goto LAB_00166213;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( sqlite3PagerPageRefcount(pPage->pDbPage)>1 ){
      /* The page being written is not a root page, and there is currently
      ** more than one reference to it. This only happens if the page is one
      ** of its own ancestor pages. Corruption. */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}